

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

uint8 * __thiscall
google::protobuf::GeneratedCodeInfo::InternalSerializeWithCachedSizesToArray
          (GeneratedCodeInfo *this,uint8 *target,EpsCopyOutputStream *stream)

{
  int iVar1;
  GeneratedCodeInfo_Annotation *this_00;
  void *pvVar2;
  uint8 *target_00;
  int iVar3;
  uint8 *local_38;
  
  iVar1 = (this->annotation_).super_RepeatedPtrFieldBase.current_size_;
  local_38 = target;
  for (iVar3 = 0; iVar1 != iVar3; iVar3 = iVar3 + 1) {
    io::EpsCopyOutputStream::EnsureSpace(stream,&local_38);
    this_00 = (GeneratedCodeInfo_Annotation *)
              ((this->annotation_).super_RepeatedPtrFieldBase.rep_)->elements[iVar3];
    *local_38 = '\n';
    target_00 = io::CodedOutputStream::WriteVarint32ToArray
                          ((this_00->_cached_size_).size_.super___atomic_base<int>._M_i,local_38 + 1
                          );
    local_38 = GeneratedCodeInfo_Annotation::InternalSerializeWithCachedSizesToArray
                         (this_00,target_00,stream);
  }
  pvVar2 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    local_38 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                         ((UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe),local_38,stream);
  }
  return local_38;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* GeneratedCodeInfo::InternalSerializeWithCachedSizesToArray(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.GeneratedCodeInfo)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated .google.protobuf.GeneratedCodeInfo.Annotation annotation = 1;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_annotation_size()); i < n; i++) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(1, this->_internal_annotation(i), target, stream);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields(), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.GeneratedCodeInfo)
  return target;
}